

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

void runhcmp(runcxdef *ctx,uint siz,uint below,runsdef *val1,runsdef *val2,runsdef *val3)

{
  runcxdef *prVar1;
  long lVar2;
  byte *pbVar3;
  bool bVar4;
  int iVar5;
  runcxdef *prVar6;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  long in_R8;
  long in_R9;
  int ref;
  uchar *hnxt;
  uchar *dst;
  runsdef *sp;
  runsdef *stk;
  runsdef *stop;
  uchar *htop;
  uchar *hp;
  int in_stack_ffffffffffffff7c;
  runcxdef *in_stack_ffffffffffffff80;
  runcxdef *local_58;
  byte *local_50;
  runcxdef *local_30;
  
  local_58 = (runcxdef *)in_RDI[6];
  prVar1 = (runcxdef *)in_RDI[7];
  lVar2 = in_RDI[4];
  pbVar3 = (byte *)in_RDI[2];
  prVar6 = local_58;
  while (local_30 = prVar6, local_30 < prVar1) {
    iVar5 = osrp2(local_30);
    prVar6 = (runcxdef *)((long)&local_30->runcxerr + (long)iVar5);
    bVar4 = false;
    for (local_50 = pbVar3; local_50 < (byte *)(lVar2 + (ulong)in_EDX * 0x10);
        local_50 = local_50 + 0x10) {
      if (((*local_50 | 4) == 7) && (*(runcxdef **)(local_50 + 8) == local_30)) {
        bVar4 = true;
        *(runcxdef **)(local_50 + 8) = local_58;
      }
    }
    if ((in_RCX != 0) && (*(runcxdef **)(in_RCX + 8) == local_30)) {
      bVar4 = true;
      *(runcxdef **)(in_RCX + 8) = local_58;
    }
    if ((in_R8 != 0) && (*(runcxdef **)(in_R8 + 8) == local_30)) {
      bVar4 = true;
      *(runcxdef **)(in_R8 + 8) = local_58;
    }
    if ((in_R9 != 0) && (*(runcxdef **)(in_R9 + 8) == local_30)) {
      bVar4 = true;
      *(runcxdef **)(in_R9 + 8) = local_58;
    }
    if (bVar4) {
      if (local_30 != local_58) {
        in_stack_ffffffffffffff80 = local_58;
        iVar5 = osrp2(local_30);
        memmove(in_stack_ffffffffffffff80,local_30,(long)iVar5);
      }
      iVar5 = osrp2(local_58);
      local_58 = (runcxdef *)((long)&local_58->runcxerr + (long)iVar5);
    }
  }
  in_RDI[7] = local_58;
  if (in_ESI <= (uint)((int)in_RDI[8] - (int)in_RDI[7])) {
    return;
  }
  *(undefined4 *)(*(long *)*in_RDI + 0x68) = 0;
  runsign(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
}

Assistant:

void runhcmp(runcxdef *ctx, uint siz, uint below,
             runsdef *val1, runsdef *val2, runsdef *val3)
{
    uchar   *hp   = ctx->runcxheap;
    uchar   *htop = ctx->runcxhp;
    runsdef *stop = ctx->runcxsp + below;
    runsdef *stk  = ctx->runcxstk;
    runsdef *sp;
    uchar   *dst  = hp;
    uchar   *hnxt;
    int      ref;
    
    /* go through heap, finding references on stack */
    for ( ; hp < htop ; hp = hnxt)
    {
        hnxt = hp + osrp2(hp);                /* remember next heap element */

        for (ref = FALSE, sp = stk ; sp < stop ; ++sp)
        {
            switch(sp->runstyp)
            {
            case DAT_SSTRING:
            case DAT_LIST:
                if (sp->runsv.runsvstr == hp)    /* reference to this item? */
                {
                    ref = TRUE;             /* this heap item is referenced */
                    sp->runsv.runsvstr = dst;      /* reflect imminent move */
                }
                break;
                
            default:                /* other types do not refer to the heap */
                break;
            }
        }

        /* check the explicitly referenced value pointers as well */
#define CHECK_VAL(val) \
        if (val && val->runsv.runsvstr == hp) \
            ref = TRUE, val->runsv.runsvstr = dst;
        CHECK_VAL(val1);
        CHECK_VAL(val2);
        CHECK_VAL(val3);
#undef CHECK_VAL

        /* if referenced, copy it to dst and advance dst */
        if (ref)
        {
            if (hp != dst) memmove(dst, hp, (size_t)osrp2(hp));
            dst += osrp2(dst);
        }
    }

    /* set heap pointer based on shuffled heap */
    ctx->runcxhp = dst;
    
    /* check for space requested, and signal error if not available */
    if ((uint)(ctx->runcxhtop - ctx->runcxhp) < siz)
        runsig(ctx, ERR_HPOVF);
}